

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__read_next_flac_frame_header
                    (ma_dr_flac_bs *bs,ma_uint8 streaminfoBitsPerSample,
                    ma_dr_flac_frame_header *header)

{
  byte bVar1;
  ma_bool32 mVar2;
  ma_result result_1;
  ma_uint64 flacFrameNumber;
  ma_result result;
  ma_uint64 pcmFrameNumber;
  ma_bool32 isVariableBlockSize;
  ma_uint8 bitsPerSample;
  ma_uint8 channelAssignment;
  ma_uint8 sampleRate;
  ma_uint8 blockSize;
  ma_uint8 blockingStrategy;
  ma_uint8 reserved;
  ma_uint8 crc8;
  ma_uint8 bitsPerSampleTable [8];
  ma_uint32 sampleRateTable [12];
  ma_uint32 resultHi_2;
  ma_uint32 bitCountLo_2;
  ma_uint32 bitCountHi_2;
  ma_uint32 resultHi_1;
  ma_uint32 bitCountLo_1;
  ma_uint32 bitCountHi_1;
  ma_uint32 resultHi;
  ma_uint32 bitCountLo;
  ma_uint32 bitCountHi;
  ma_uint64 leftoverDataMask_11;
  ma_uint32 leftoverBits_11;
  ma_uint32 wholeBytes_11;
  ma_uint64 leftoverDataMask_10;
  ma_uint32 leftoverBits_10;
  ma_uint32 wholeBytes_10;
  ma_uint64 leftoverDataMask_9;
  ma_uint32 leftoverBits_9;
  ma_uint32 wholeBytes_9;
  ma_uint64 leftoverDataMask_8;
  ma_uint32 leftoverBits_8;
  ma_uint32 wholeBytes_8;
  ma_uint64 leftoverDataMask_7;
  ma_uint32 leftoverBits_7;
  ma_uint32 wholeBytes_7;
  ma_uint64 leftoverDataMask_6;
  ma_uint32 leftoverBits_6;
  ma_uint32 wholeBytes_6;
  ma_uint64 leftoverDataMask_5;
  ma_uint32 leftoverBits_5;
  ma_uint32 wholeBytes_5;
  ma_uint64 leftoverDataMask_4;
  ma_uint32 leftoverBits_4;
  ma_uint32 wholeBytes_4;
  ma_uint64 leftoverDataMask_3;
  ma_uint32 leftoverBits_3;
  ma_uint32 wholeBytes_3;
  ma_uint64 leftoverDataMask_2;
  ma_uint32 leftoverBits_2;
  ma_uint32 wholeBytes_2;
  ma_uint64 leftoverDataMask_1;
  ma_uint32 leftoverBits_1;
  ma_uint32 wholeBytes_1;
  ma_uint64 leftoverDataMask;
  ma_uint32 leftoverBits;
  ma_uint32 wholeBytes;
  undefined4 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc64;
  undefined1 in_stack_fffffffffffffc65;
  undefined2 in_stack_fffffffffffffc66;
  undefined8 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc74;
  undefined1 in_stack_fffffffffffffc75;
  undefined2 in_stack_fffffffffffffc76;
  undefined1 local_2a8 [532];
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  byte local_81;
  undefined8 local_80;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  byte local_61;
  
  memcpy(local_2a8,&DAT_002aae20,0x30);
  do {
    mVar2 = ma_dr_flac__find_and_seek_to_next_sync_code
                      ((ma_dr_flac_bs *)
                       CONCAT26(in_stack_fffffffffffffc66,
                                CONCAT15(in_stack_fffffffffffffc65,
                                         CONCAT14(in_stack_fffffffffffffc64,
                                                  in_stack_fffffffffffffc60))));
    if (mVar2 == 0) {
      return 0;
    }
    mVar2 = ma_dr_flac__read_uint8
                      ((ma_dr_flac_bs *)
                       CONCAT26(in_stack_fffffffffffffc76,
                                CONCAT15(in_stack_fffffffffffffc75,
                                         CONCAT14(in_stack_fffffffffffffc74,
                                                  in_stack_fffffffffffffc70))),
                       (uint)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                       (ma_uint8 *)
                       CONCAT26(in_stack_fffffffffffffc66,
                                CONCAT15(in_stack_fffffffffffffc65,
                                         CONCAT14(in_stack_fffffffffffffc64,
                                                  in_stack_fffffffffffffc60))));
    if (mVar2 == 0) {
      return 0;
    }
    local_68 = 0;
    local_6c = 1;
    local_70 = 0;
    local_74 = 1;
    local_80 = ma_dr_flac_crc8(unsigned_char,unsigned_int,unsigned_int)::leftoverDataMaskTable._8_8_
    ;
    bVar1 = ma_dr_flac__crc8_table[1] ^ 0x9c;
    local_61 = bVar1;
    mVar2 = ma_dr_flac__read_uint8
                      ((ma_dr_flac_bs *)
                       CONCAT26(in_stack_fffffffffffffc76,
                                CONCAT15(in_stack_fffffffffffffc75,
                                         CONCAT14(in_stack_fffffffffffffc74,
                                                  in_stack_fffffffffffffc70))),
                       (uint)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                       (ma_uint8 *)
                       CONCAT26(in_stack_fffffffffffffc66,
                                CONCAT15(in_stack_fffffffffffffc65,
                                         CONCAT14(in_stack_fffffffffffffc64,
                                                  in_stack_fffffffffffffc60))));
    if (mVar2 == 0) {
      return 0;
    }
    local_88 = 0;
    local_8c = 1;
    local_90 = 0;
    local_94 = 1;
    local_2a8._520_8_ =
         ma_dr_flac_crc8(unsigned_char,unsigned_int,unsigned_int)::leftoverDataMaskTable._8_8_;
    local_81 = bVar1 << 1 ^ ma_dr_flac__crc8_table[(int)(uint)bVar1 >> 7];
    mVar2 = ma_dr_flac__read_uint8
                      ((ma_dr_flac_bs *)
                       CONCAT26(in_stack_fffffffffffffc76,
                                CONCAT15(in_stack_fffffffffffffc75,
                                         CONCAT14(in_stack_fffffffffffffc74,
                                                  in_stack_fffffffffffffc70))),
                       (uint)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                       (ma_uint8 *)
                       CONCAT26(in_stack_fffffffffffffc66,
                                CONCAT15(in_stack_fffffffffffffc65,
                                         CONCAT14(in_stack_fffffffffffffc64,
                                                  in_stack_fffffffffffffc60))));
  } while (mVar2 != 0);
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__read_next_flac_frame_header(ma_dr_flac_bs* bs, ma_uint8 streaminfoBitsPerSample, ma_dr_flac_frame_header* header)
{
    const ma_uint32 sampleRateTable[12]  = {0, 88200, 176400, 192000, 8000, 16000, 22050, 24000, 32000, 44100, 48000, 96000};
    const ma_uint8 bitsPerSampleTable[8] = {0, 8, 12, (ma_uint8)-1, 16, 20, 24, (ma_uint8)-1};
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(header != NULL);
    for (;;) {
        ma_uint8 crc8 = 0xCE;
        ma_uint8 reserved = 0;
        ma_uint8 blockingStrategy = 0;
        ma_uint8 blockSize = 0;
        ma_uint8 sampleRate = 0;
        ma_uint8 channelAssignment = 0;
        ma_uint8 bitsPerSample = 0;
        ma_bool32 isVariableBlockSize;
        if (!ma_dr_flac__find_and_seek_to_next_sync_code(bs)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_uint8(bs, 1, &reserved)) {
            return MA_FALSE;
        }
        if (reserved == 1) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, reserved, 1);
        if (!ma_dr_flac__read_uint8(bs, 1, &blockingStrategy)) {
            return MA_FALSE;
        }
        crc8 = ma_dr_flac_crc8(crc8, blockingStrategy, 1);
        if (!ma_dr_flac__read_uint8(bs, 4, &blockSize)) {
            return MA_FALSE;
        }
        if (blockSize == 0) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, blockSize, 4);
        if (!ma_dr_flac__read_uint8(bs, 4, &sampleRate)) {
            return MA_FALSE;
        }
        crc8 = ma_dr_flac_crc8(crc8, sampleRate, 4);
        if (!ma_dr_flac__read_uint8(bs, 4, &channelAssignment)) {
            return MA_FALSE;
        }
        if (channelAssignment > 10) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, channelAssignment, 4);
        if (!ma_dr_flac__read_uint8(bs, 3, &bitsPerSample)) {
            return MA_FALSE;
        }
        if (bitsPerSample == 3 || bitsPerSample == 7) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, bitsPerSample, 3);
        if (!ma_dr_flac__read_uint8(bs, 1, &reserved)) {
            return MA_FALSE;
        }
        if (reserved == 1) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, reserved, 1);
        isVariableBlockSize = blockingStrategy == 1;
        if (isVariableBlockSize) {
            ma_uint64 pcmFrameNumber;
            ma_result result = ma_dr_flac__read_utf8_coded_number(bs, &pcmFrameNumber, &crc8);
            if (result != MA_SUCCESS) {
                if (result == MA_AT_END) {
                    return MA_FALSE;
                } else {
                    continue;
                }
            }
            header->flacFrameNumber  = 0;
            header->pcmFrameNumber = pcmFrameNumber;
        } else {
            ma_uint64 flacFrameNumber = 0;
            ma_result result = ma_dr_flac__read_utf8_coded_number(bs, &flacFrameNumber, &crc8);
            if (result != MA_SUCCESS) {
                if (result == MA_AT_END) {
                    return MA_FALSE;
                } else {
                    continue;
                }
            }
            header->flacFrameNumber  = (ma_uint32)flacFrameNumber;
            header->pcmFrameNumber = 0;
        }
        MA_DR_FLAC_ASSERT(blockSize > 0);
        if (blockSize == 1) {
            header->blockSizeInPCMFrames = 192;
        } else if (blockSize <= 5) {
            MA_DR_FLAC_ASSERT(blockSize >= 2);
            header->blockSizeInPCMFrames = 576 * (1 << (blockSize - 2));
        } else if (blockSize == 6) {
            if (!ma_dr_flac__read_uint16(bs, 8, &header->blockSizeInPCMFrames)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->blockSizeInPCMFrames, 8);
            header->blockSizeInPCMFrames += 1;
        } else if (blockSize == 7) {
            if (!ma_dr_flac__read_uint16(bs, 16, &header->blockSizeInPCMFrames)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->blockSizeInPCMFrames, 16);
            if (header->blockSizeInPCMFrames == 0xFFFF) {
                return MA_FALSE;
            }
            header->blockSizeInPCMFrames += 1;
        } else {
            MA_DR_FLAC_ASSERT(blockSize >= 8);
            header->blockSizeInPCMFrames = 256 * (1 << (blockSize - 8));
        }
        if (sampleRate <= 11) {
            header->sampleRate = sampleRateTable[sampleRate];
        } else if (sampleRate == 12) {
            if (!ma_dr_flac__read_uint32(bs, 8, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 8);
            header->sampleRate *= 1000;
        } else if (sampleRate == 13) {
            if (!ma_dr_flac__read_uint32(bs, 16, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 16);
        } else if (sampleRate == 14) {
            if (!ma_dr_flac__read_uint32(bs, 16, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 16);
            header->sampleRate *= 10;
        } else {
            continue;
        }
        header->channelAssignment = channelAssignment;
        header->bitsPerSample = bitsPerSampleTable[bitsPerSample];
        if (header->bitsPerSample == 0) {
            header->bitsPerSample = streaminfoBitsPerSample;
        }
        if (header->bitsPerSample != streaminfoBitsPerSample) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_uint8(bs, 8, &header->crc8)) {
            return MA_FALSE;
        }
#ifndef MA_DR_FLAC_NO_CRC
        if (header->crc8 != crc8) {
            continue;
        }
#endif
        return MA_TRUE;
    }
}